

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_data_source_seek_to_pcm_frame(ma_data_source *pDataSource,ma_uint64 frameIndex)

{
  ma_result mVar1;
  
  if (pDataSource == (ma_data_source *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (*(code **)(*pDataSource + 8) != (code *)0x0) {
    if (*(ulong *)((long)pDataSource + 0x10) < frameIndex) {
      return MA_INVALID_OPERATION;
    }
    mVar1 = (**(code **)(*pDataSource + 8))
                      (pDataSource,frameIndex + *(long *)((long)pDataSource + 8));
    return mVar1;
  }
  return MA_NOT_IMPLEMENTED;
}

Assistant:

MA_API ma_result ma_data_source_seek_to_pcm_frame(ma_data_source* pDataSource, ma_uint64 frameIndex)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;

    if (pDataSourceBase == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pDataSourceBase->vtable->onSeek == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    if (frameIndex > pDataSourceBase->rangeEndInFrames) {
        return MA_INVALID_OPERATION;    /* Trying to seek too far forward. */
    }

    MA_ASSERT(pDataSourceBase->vtable != NULL);

    return pDataSourceBase->vtable->onSeek(pDataSource, pDataSourceBase->rangeBegInFrames + frameIndex);
}